

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O1

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::match
          (DecimalMatcher *this,StringSegment *segment,ParsedNumber *result,int8_t exponentSign,
          UErrorCode *param_4)

{
  bool bVar1;
  short sVar2;
  UnicodeString *pUVar3;
  bool bVar4;
  UBool UVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint c;
  int32_t iVar8;
  undefined4 uVar9;
  UnicodeString *pUVar10;
  int64_t iVar11;
  undefined7 in_register_00000009;
  __off_t __length;
  int32_t i;
  long lVar12;
  int iVar13;
  char *__file;
  long lVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  UnicodeString actualDecimalString;
  DecimalQuantity digitsConsumed;
  UnicodeString actualGroupingString;
  int local_194;
  int local_190;
  int local_18c;
  int32_t local_180;
  int32_t local_17c;
  int local_174;
  int32_t local_164;
  int local_154;
  UnicodeString local_140;
  DecimalQuantity local_100;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  bVar4 = ParsedNumber::seenNumber(result);
  if (exponentSign == '\0' && bVar4) {
    bVar4 = false;
  }
  else {
    iVar6 = StringSegment::getOffset(segment);
    icu_63::number::impl::DecimalQuantity::DecimalQuantity(&local_100);
    local_100.bogus = true;
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_140.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_140.fUnion.fStackFields.fLengthAndFlags = 2;
    UnicodeString::setToBogus(&local_b0);
    UnicodeString::setToBogus(&local_140);
    local_18c = 0;
    local_190 = -1;
    local_174 = -1;
    local_17c = -1;
    local_194 = 0;
    local_180 = 0;
    local_154 = 0;
    bVar16 = false;
    do {
      iVar7 = StringSegment::length(segment);
      if (iVar7 < 1) break;
      c = StringSegment::getCodePoint(segment);
      UVar5 = u_isdigit_63(c);
      if (UVar5 == '\0') {
        local_164 = 0xff;
      }
      else {
        StringSegment::adjustOffset(segment,2 - (uint)(c < 0x10000));
        local_164 = u_digit_63(c,'\n');
      }
      if (((char)local_164 == -1) &&
         ((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr !=
          (UnicodeString *)0x0)) {
        lVar14 = 0;
        lVar12 = 0;
        bVar16 = false;
        do {
          pUVar10 = (this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.
                    ptr;
          iVar15 = 6;
          if (0x1f < *(ushort *)((long)&pUVar10->fUnion + lVar14)) {
            iVar7 = StringSegment::getCommonPrefixLength
                              (segment,(UnicodeString *)
                                       ((long)&(pUVar10->super_Replaceable).super_UObject.
                                               _vptr_UObject + lVar14));
            sVar2 = *(short *)((long)&pUVar10->fUnion + lVar14);
            if (sVar2 < 0) {
              iVar15 = *(int *)((long)&pUVar10->fUnion + lVar14 + 4);
            }
            else {
              iVar15 = (int)sVar2 >> 5;
            }
            if (iVar7 == iVar15) {
              StringSegment::adjustOffset(segment,iVar7);
              iVar15 = 4;
              local_164 = (int32_t)lVar12;
            }
            else {
              iVar15 = 0;
              if (bVar16) {
                bVar16 = true;
              }
              else {
                iVar8 = StringSegment::length(segment);
                bVar16 = iVar7 == iVar8;
              }
            }
          }
          if ((iVar15 != 6) && (iVar15 != 0)) break;
          lVar12 = lVar12 + 1;
          lVar14 = lVar14 + 0x40;
        } while (lVar12 != 10);
      }
      else {
        bVar16 = false;
      }
      iVar15 = local_194;
      if ((char)local_164 < '\0') {
        bVar4 = false;
        if (((local_140.fUnion._0_4_ & 1) != 0) &&
           (0x1f < (ushort)(this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags)) {
          iVar7 = StringSegment::getCommonPrefixLength(segment,&this->decimalSeparator);
          bVar4 = bVar16 == false;
          bVar16 = true;
          if (bVar4) {
            iVar8 = StringSegment::length(segment);
            bVar16 = iVar7 == iVar8;
          }
          sVar2 = (this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar13 = (this->decimalSeparator).fUnion.fFields.fLength;
          }
          else {
            iVar13 = (int)sVar2 >> 5;
          }
          if (iVar7 == iVar13) {
            bVar4 = true;
            UnicodeString::operator=(&local_140,&this->decimalSeparator);
          }
          else {
            bVar4 = false;
          }
        }
        if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          iVar7 = StringSegment::getCommonPrefixLength(segment,&local_b0);
          bVar18 = bVar16 == false;
          bVar16 = true;
          if (bVar18) {
            iVar8 = StringSegment::length(segment);
            bVar16 = iVar7 == iVar8;
          }
          uVar9 = local_b0.fUnion.fFields.fLength;
          if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          bVar18 = iVar7 == uVar9;
        }
        else {
          bVar18 = false;
        }
        if ((((this->groupingDisabled == false) &&
             ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) != 0)) &&
            ((local_140.fUnion._0_4_ & 1) != 0)) &&
           (0x1f < (ushort)(this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags)) {
          iVar7 = StringSegment::getCommonPrefixLength(segment,&this->groupingSeparator);
          bVar19 = bVar16 == false;
          bVar16 = true;
          if (bVar19) {
            iVar8 = StringSegment::length(segment);
            bVar16 = iVar7 == iVar8;
          }
          sVar2 = (this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar13 = (this->groupingSeparator).fUnion.fFields.fLength;
          }
          else {
            iVar13 = (int)sVar2 >> 5;
          }
          if (iVar7 == iVar13) {
            bVar18 = true;
            UnicodeString::operator=(&local_b0,&this->groupingSeparator);
          }
        }
        if (((bVar18 == false) && ((local_140.fUnion._0_4_ & 1) != 0)) &&
           (UVar5 = UnicodeSet::contains(this->decimalUniSet,c), UVar5 != '\0')) {
          UnicodeString::UnicodeString(&local_70,c);
          UnicodeString::moveFrom(&local_140,&local_70);
          UnicodeString::~UnicodeString(&local_70);
          bVar4 = true;
        }
        if (((this->groupingDisabled == false) &&
            ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) != 0)) &&
           (((local_140.fUnion._0_4_ & 1) != 0 &&
            (UVar5 = UnicodeSet::contains(this->groupingUniSet,c), UVar5 != '\0')))) {
          UnicodeString::UnicodeString(&local_70,c);
          UnicodeString::moveFrom(&local_b0,&local_70);
          UnicodeString::~UnicodeString(&local_70);
          bVar18 = true;
        }
        bVar19 = true;
        if (bVar4) {
          if (this->integerOnly == false) {
LAB_00283bde:
            if ((local_194 == 2) && (bVar18 != false)) {
              local_194 = 2;
LAB_00283d02:
              bVar19 = true;
              iVar15 = local_194;
            }
            else {
              bVar1 = this->requireGroupingMatch;
              if (bVar1 == true) {
                if (local_174 == 1) {
                  bVar19 = local_190 == this->grouping2;
                }
                else {
                  bVar19 = true;
                  if (local_174 == 0) {
                    bVar19 = local_190 <= this->grouping2 && local_190 != 0;
                  }
                }
              }
              else {
                bVar19 = local_190 != 1 || local_174 != 1;
              }
              if (bVar1 == false) {
                bVar17 = local_18c != 1 || local_194 != 1;
              }
              else {
                bVar17 = true;
                if (local_194 == 1) {
                  bVar17 = local_18c == this->grouping1;
                }
              }
              if ((bool)(bVar19 & (bVar4 ^ 1U | bVar17))) {
                if (((bVar1 != false) && (local_18c == 0)) && (local_194 == 1)) {
                  local_194 = 1;
                  local_18c = 0;
                  goto LAB_00283d02;
                }
                if (bVar4) {
                  local_194 = -1;
                }
                iVar7 = local_180;
                if (local_18c != 0) {
                  iVar7 = StringSegment::getOffset(segment);
                }
                pUVar10 = &local_140;
                if (bVar18 != false) {
                  pUVar10 = &local_b0;
                }
                pUVar3 = &local_140;
                if (bVar18 != false) {
                  pUVar3 = &local_b0;
                }
                sVar2 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
                if (sVar2 < 0) {
                  iVar8 = (pUVar10->fUnion).fFields.fLength;
                }
                else {
                  iVar8 = (int)sVar2 >> 5;
                }
                StringSegment::adjustOffset(segment,iVar8);
                bVar19 = false;
                local_190 = local_18c;
                local_17c = local_180;
                local_18c = 0;
                iVar15 = 2 - (uint)bVar18;
                local_180 = iVar7;
                local_174 = local_194;
              }
              else {
                bVar19 = true;
                if (((bVar18 & local_18c == 0) == 0) && (bVar1 != false)) {
                  icu_63::number::impl::DecimalQuantity::clear(&local_100);
                  local_100.bogus = true;
                }
              }
            }
          }
        }
        else if (bVar18 != false) goto LAB_00283bde;
      }
      else {
        if (local_100.bogus == true) {
          local_100.bogus = false;
          icu_63::number::impl::DecimalQuantity::clear(&local_100);
        }
        icu_63::number::impl::DecimalQuantity::appendDigit(&local_100,(char)local_164,0,true);
        local_18c = local_18c + 1;
        local_154 = local_154 + (~local_140.fUnion._0_4_ & 1);
        bVar19 = false;
      }
      local_194 = iVar15;
    } while (!bVar19);
    iVar7 = local_17c;
    iVar15 = local_190;
    if (local_18c == 0 && local_194 != 2) {
      StringSegment::setOffset(segment,local_180);
      bVar16 = true;
      iVar7 = -1;
      iVar15 = 1;
      local_194 = local_174;
      local_174 = 0;
    }
    else {
      local_190 = local_18c;
      local_17c = local_180;
    }
    bVar4 = this->requireGroupingMatch;
    if (bVar4 == true) {
      if (local_174 == 1) {
        bVar18 = iVar15 == this->grouping2;
      }
      else {
        bVar18 = true;
        if (local_174 == 0) {
          bVar18 = iVar15 <= this->grouping2 && iVar15 != 0;
        }
      }
    }
    else {
      bVar18 = iVar15 != 1 || local_174 != 1;
    }
    if (bVar4 == false) {
      bVar19 = local_190 != 1 || local_194 != 1;
    }
    else {
      bVar19 = true;
      if (local_194 == 1) {
        bVar19 = local_190 == this->grouping1;
      }
    }
    if (bVar4 == false) {
      if (bVar18) {
        iVar13 = 0;
        if (!(bool)((local_174 == 0 && iVar15 == 0) | bVar19)) {
          bVar16 = true;
          StringSegment::setOffset(segment,local_17c);
          iVar13 = local_190;
        }
      }
      else {
        StringSegment::setOffset(segment,iVar7);
        iVar13 = local_190 + iVar15;
      }
      bVar18 = true;
      if (iVar13 == 0) {
        bVar19 = true;
      }
      else {
        __file = (char *)(ulong)(uint)-iVar13;
        icu_63::number::impl::DecimalQuantity::adjustMagnitude(&local_100,-iVar13);
        icu_63::number::impl::DecimalQuantity::truncate(&local_100,__file,__length);
        bVar19 = true;
      }
    }
    if ((local_194 != 2) && (!(bool)(bVar18 & bVar19))) {
      local_100.bogus = true;
    }
    if (local_100.bogus == true) {
      bVar4 = true;
      if (bVar16 == false) {
        iVar7 = StringSegment::length(segment);
        bVar4 = iVar7 == 0;
      }
      StringSegment::setOffset(segment,iVar6);
    }
    else {
      icu_63::number::impl::DecimalQuantity::adjustMagnitude(&local_100,-local_154);
      if ((exponentSign == '\0') || (iVar7 = StringSegment::getOffset(segment), iVar7 == iVar6)) {
        icu_63::number::impl::DecimalQuantity::operator=(&result->quantity,&local_100);
      }
      else {
        bVar4 = icu_63::number::impl::DecimalQuantity::fitsInLong(&local_100,false);
        if (((!bVar4) ||
            (iVar11 = icu_63::number::impl::DecimalQuantity::toLong(&local_100,false),
            0x7fffffff < iVar11)) ||
           (bVar4 = icu_63::number::impl::DecimalQuantity::adjustMagnitude
                              (&result->quantity,
                               (int)iVar11 * (int)CONCAT71(in_register_00000009,exponentSign)),
           bVar4)) {
          if (exponentSign == -1) {
            icu_63::number::impl::DecimalQuantity::clear(&result->quantity);
          }
          else {
            (result->quantity).bogus = true;
            *(byte *)&result->flags = (byte)result->flags | 0x80;
          }
        }
      }
      if ((local_140.fUnion._0_4_ & 1) == 0) {
        *(byte *)&result->flags = (byte)result->flags | 0x20;
      }
      ParsedNumber::setCharsConsumed(result,segment);
      iVar6 = StringSegment::length(segment);
      bVar4 = (bool)(iVar6 == 0 | bVar16);
    }
    UnicodeString::~UnicodeString(&local_140);
    UnicodeString::~UnicodeString(&local_b0);
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_100);
  }
  return bVar4;
}

Assistant:

bool DecimalMatcher::match(StringSegment& segment, ParsedNumber& result, int8_t exponentSign,
                           UErrorCode&) const {
    if (result.seenNumber() && exponentSign == 0) {
        // A number has already been consumed.
        return false;
    } else if (exponentSign != 0) {
        // scientific notation always comes after the number
        U_ASSERT(!result.quantity.bogus);
    }

    // Initial offset before any character consumption.
    int32_t initialOffset = segment.getOffset();

    // Return value: whether to ask for more characters.
    bool maybeMore = false;

    // All digits consumed so far.
    number::impl::DecimalQuantity digitsConsumed;
    digitsConsumed.bogus = true;

    // The total number of digits after the decimal place, used for scaling the result.
    int32_t digitsAfterDecimalPlace = 0;

    // The actual grouping and decimal separators used in the string.
    // If non-null, we have seen that token.
    UnicodeString actualGroupingString;
    UnicodeString actualDecimalString;
    actualGroupingString.setToBogus();
    actualDecimalString.setToBogus();

    // Information for two groups: the previous group and the current group.
    //
    // Each group has three pieces of information:
    //
    // Offset: the string position of the beginning of the group, including a leading separator
    // if there was a leading separator. This is needed in case we need to rewind the parse to
    // that position.
    //
    // Separator type:
    // 0 => beginning of string
    // 1 => lead separator is a grouping separator
    // 2 => lead separator is a decimal separator
    //
    // Count: the number of digits in the group. If -1, the group has been validated.
    int32_t currGroupOffset = 0;
    int32_t currGroupSepType = 0;
    int32_t currGroupCount = 0;
    int32_t prevGroupOffset = -1;
    int32_t prevGroupSepType = -1;
    int32_t prevGroupCount = -1;

    while (segment.length() > 0) {
        maybeMore = false;

        // Attempt to match a digit.
        int8_t digit = -1;

        // Try by code point digit value.
        UChar32 cp = segment.getCodePoint();
        if (u_isdigit(cp)) {
            segment.adjustOffset(U16_LENGTH(cp));
            digit = static_cast<int8_t>(u_digit(cp, 10));
        }

        // Try by digit string.
        if (digit == -1 && !fLocalDigitStrings.isNull()) {
            for (int32_t i = 0; i < 10; i++) {
                const UnicodeString& str = fLocalDigitStrings[i];
                if (str.isEmpty()) {
                    continue;
                }
                int32_t overlap = segment.getCommonPrefixLength(str);
                if (overlap == str.length()) {
                    segment.adjustOffset(overlap);
                    digit = static_cast<int8_t>(i);
                    break;
                }
                maybeMore = maybeMore || (overlap == segment.length());
            }
        }

        if (digit >= 0) {
            // Digit was found.
            if (digitsConsumed.bogus) {
                digitsConsumed.bogus = false;
                digitsConsumed.clear();
            }
            digitsConsumed.appendDigit(digit, 0, true);
            currGroupCount++;
            if (!actualDecimalString.isBogus()) {
                digitsAfterDecimalPlace++;
            }
            continue;
        }

        // Attempt to match a literal grouping or decimal separator.
        bool isDecimal = false;
        bool isGrouping = false;

        // 1) Attempt the decimal separator string literal.
        // if (we have not seen a decimal separator yet) { ... }
        if (actualDecimalString.isBogus() && !decimalSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(decimalSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == decimalSeparator.length()) {
                isDecimal = true;
                actualDecimalString = decimalSeparator;
            }
        }

        // 2) Attempt to match the actual grouping string literal.
        if (!actualGroupingString.isBogus()) {
            int32_t overlap = segment.getCommonPrefixLength(actualGroupingString);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == actualGroupingString.length()) {
                isGrouping = true;
            }
        }

        // 2.5) Attempt to match a new the grouping separator string literal.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus() &&
            !groupingSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(groupingSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == groupingSeparator.length()) {
                isGrouping = true;
                actualGroupingString = groupingSeparator;
            }
        }

        // 3) Attempt to match a decimal separator from the equivalence set.
        // if (we have not seen a decimal separator yet) { ... }
        // The !isGrouping is to confirm that we haven't yet matched the current character.
        if (!isGrouping && actualDecimalString.isBogus()) {
            if (decimalUniSet->contains(cp)) {
                isDecimal = true;
                actualDecimalString = UnicodeString(cp);
            }
        }

        // 4) Attempt to match a grouping separator from the equivalence set.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus()) {
            if (groupingUniSet->contains(cp)) {
                isGrouping = true;
                actualGroupingString = UnicodeString(cp);
            }
        }

        // Leave if we failed to match this as a separator.
        if (!isDecimal && !isGrouping) {
            break;
        }

        // Check for conditions when we don't want to accept the separator.
        if (isDecimal && integerOnly) {
            break;
        } else if (currGroupSepType == 2 && isGrouping) {
            // Fraction grouping
            break;
        }

        // Validate intermediate grouping sizes.
        bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
        bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
        if (!prevValidSecondary || (isDecimal && !currValidPrimary)) {
            // Invalid grouping sizes.
            if (isGrouping && currGroupCount == 0) {
                // Trailing grouping separators: these are taken care of below
                U_ASSERT(currGroupSepType == 1);
            } else if (requireGroupingMatch) {
                // Strict mode: reject the parse
                digitsConsumed.clear();
                digitsConsumed.bogus = true;
            }
            break;
        } else if (requireGroupingMatch && currGroupCount == 0 && currGroupSepType == 1) {
            break;
        } else {
            // Grouping sizes OK so far.
            prevGroupOffset = currGroupOffset;
            prevGroupCount = currGroupCount;
            if (isDecimal) {
                // Do not validate this group any more.
                prevGroupSepType = -1;
            } else {
                prevGroupSepType = currGroupSepType;
            }
        }

        // OK to accept the separator.
        // Special case: don't update currGroup if it is empty; this allows two grouping
        // separators in a row in lenient mode.
        if (currGroupCount != 0) {
            currGroupOffset = segment.getOffset();
        }
        currGroupSepType = isGrouping ? 1 : 2;
        currGroupCount = 0;
        if (isGrouping) {
            segment.adjustOffset(actualGroupingString.length());
        } else {
            segment.adjustOffset(actualDecimalString.length());
        }
    }

    // End of main loop.
    // Back up if there was a trailing grouping separator.
    // Shift prev -> curr so we can check it as a final group.
    if (currGroupSepType != 2 && currGroupCount == 0) {
        maybeMore = true;
        segment.setOffset(currGroupOffset);
        currGroupOffset = prevGroupOffset;
        currGroupSepType = prevGroupSepType;
        currGroupCount = prevGroupCount;
        prevGroupOffset = -1;
        prevGroupSepType = 0;
        prevGroupCount = 1;
    }

    // Validate final grouping sizes.
    bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
    bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
    if (!requireGroupingMatch) {
        // The cases we need to handle here are lone digits.
        // Examples: "1,1"  "1,1,"  "1,1,1"  "1,1,1,"  ",1" (all parse as 1)
        // See more examples in numberformattestspecification.txt
        int32_t digitsToRemove = 0;
        if (!prevValidSecondary) {
            segment.setOffset(prevGroupOffset);
            digitsToRemove += prevGroupCount;
            digitsToRemove += currGroupCount;
        } else if (!currValidPrimary && (prevGroupSepType != 0 || prevGroupCount != 0)) {
            maybeMore = true;
            segment.setOffset(currGroupOffset);
            digitsToRemove += currGroupCount;
        }
        if (digitsToRemove != 0) {
            digitsConsumed.adjustMagnitude(-digitsToRemove);
            digitsConsumed.truncate();
        }
        prevValidSecondary = true;
        currValidPrimary = true;
    }
    if (currGroupSepType != 2 && (!prevValidSecondary || !currValidPrimary)) {
        // Grouping failure.
        digitsConsumed.bogus = true;
    }

    // Strings that start with a separator but have no digits,
    // or strings that failed a grouping size check.
    if (digitsConsumed.bogus) {
        maybeMore = maybeMore || (segment.length() == 0);
        segment.setOffset(initialOffset);
        return maybeMore;
    }

    // We passed all inspections. Start post-processing.

    // Adjust for fraction part.
    digitsConsumed.adjustMagnitude(-digitsAfterDecimalPlace);

    // Set the digits, either normal or exponent.
    if (exponentSign != 0 && segment.getOffset() != initialOffset) {
        bool overflow = false;
        if (digitsConsumed.fitsInLong()) {
            int64_t exponentLong = digitsConsumed.toLong(false);
            U_ASSERT(exponentLong >= 0);
            if (exponentLong <= INT32_MAX) {
                auto exponentInt = static_cast<int32_t>(exponentLong);
                if (result.quantity.adjustMagnitude(exponentSign * exponentInt)) {
                    overflow = true;
                }
            } else {
                overflow = true;
            }
        } else {
            overflow = true;
        }
        if (overflow) {
            if (exponentSign == -1) {
                // Set to zero
                result.quantity.clear();
            } else {
                // Set to infinity
                result.quantity.bogus = true;
                result.flags |= FLAG_INFINITY;
            }
        }
    } else {
        result.quantity = digitsConsumed;
    }

    // Set other information into the result and return.
    if (!actualDecimalString.isBogus()) {
        result.flags |= FLAG_HAS_DECIMAL_SEPARATOR;
    }
    result.setCharsConsumed(segment);
    return segment.length() == 0 || maybeMore;
}